

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx_impl.c
# Opt level: O0

memory_allocator_iface memory_allocator_nginx_iface(void)

{
  return &memory_allocator_nginx_iface::allocator_nginx_iface;
}

Assistant:

memory_allocator_iface memory_allocator_nginx_iface(void)
{
	static struct memory_allocator_iface_type allocator_nginx_iface = {
		&memory_allocator_nginx_create,
		&memory_allocator_nginx_allocate,
		&memory_allocator_nginx_reallocate,
		&memory_allocator_nginx_deallocate,
		&memory_allocator_nginx_destroy
	};

	return &allocator_nginx_iface;
}